

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O0

void __thiscall TPZFileStream::OpenRead(TPZFileStream *this,string *fileName)

{
  _Ios_Openmode _Var1;
  long in_RDI;
  
  _Var1 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)(in_RDI + 8),_Var1);
  return;
}

Assistant:

void TPZFileStream::OpenRead(const std::string &fileName) {
#ifdef PZDEBUG
    if (AmIOpenForRead()) {
        PZError<<"TPZFileStream: File is already opened"<<std::endl;
    }
#endif
    fIn.open(fileName.c_str());
#ifdef PZDEBUG
    if (!AmIOpenForRead()) {
        PZError<<"TPZFileStream: Could not open file"<<std::endl;
    }
#endif
}